

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Point2f pbrt::InvertSphericalRectangleSample
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point3f *pRect)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Tuple2<pbrt::Point2,_float> TVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar31 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float local_188;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float local_128;
  float local_e8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  
  auVar18 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).y),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).y),0x10);
  fVar23 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  auVar42 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z),0x10);
  fVar55 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar22 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar16 = vinsertps_avx(ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar31._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar31._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar31._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar31._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar31 = vfmadd231ps_fma(auVar31,auVar16,auVar16);
  auVar31 = vfmadd231ps_fma(auVar31,auVar42,auVar42);
  auVar31 = vsqrtps_avx(auVar31);
  auVar42 = vdivps_avx(auVar42,auVar31);
  auVar18 = vdivps_avx(auVar18,auVar31);
  auVar16 = vdivps_avx(auVar16,auVar31);
  auVar15 = vmovshdup_avx(auVar42);
  auVar1 = vmovshdup_avx(auVar18);
  auVar17 = vmovshdup_avx(auVar16);
  fVar56 = auVar18._0_4_;
  auVar14 = ZEXT416((uint)(fVar56 * auVar15._0_4_));
  auVar49 = vfmsub213ss_fma(auVar42,auVar1,auVar14);
  auVar13 = vfnmadd231ss_fma(auVar14,auVar15,auVar18);
  auVar27 = ZEXT416((uint)(auVar17._0_4_ * auVar42._0_4_));
  auVar14 = vfmsub213ss_fma(auVar16,auVar15,auVar27);
  auVar41 = vfnmadd231ss_fma(auVar27,auVar17,auVar42);
  auVar12 = ZEXT416((uint)(auVar1._0_4_ * auVar16._0_4_));
  auVar27 = vfmsub213ss_fma(auVar18,auVar17,auVar12);
  auVar12 = vfnmadd231ss_fma(auVar12,auVar1,auVar16);
  auVar28._0_4_ = fVar56 * fVar55;
  auVar28._4_4_ = auVar18._4_4_ * fVar55;
  auVar28._8_4_ = auVar18._8_4_ * fVar55;
  auVar28._12_4_ = auVar18._12_4_ * fVar55;
  auVar10._4_4_ = fVar23;
  auVar10._0_4_ = fVar23;
  auVar10._8_4_ = fVar23;
  auVar10._12_4_ = fVar23;
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar55 * (auVar14._0_4_ + auVar41._0_4_))),
                            ZEXT416((uint)fVar23),ZEXT416((uint)(auVar49._0_4_ + auVar13._0_4_)));
  auVar18 = vfmadd213ps_fma(auVar10,auVar16,auVar28);
  auVar14._4_4_ = fVar22;
  auVar14._0_4_ = fVar22;
  auVar14._8_4_ = fVar22;
  auVar14._12_4_ = fVar22;
  auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar22),
                            ZEXT416((uint)(auVar27._0_4_ + auVar12._0_4_)));
  auVar12 = vfmadd213ps_fma(auVar14,auVar42,auVar18);
  auVar18._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
  auVar18._8_4_ = auVar49._8_4_ ^ 0x80000000;
  auVar18._12_4_ = auVar49._12_4_ ^ 0x80000000;
  auVar14 = vminss_avx(auVar18,auVar49);
  auVar11._0_4_ = auVar31._0_4_ + auVar12._0_4_;
  auVar11._4_4_ = auVar31._4_4_ + auVar12._4_4_;
  auVar11._8_4_ = auVar31._8_4_ + auVar12._8_4_;
  auVar11._12_4_ = auVar31._12_4_ + auVar12._12_4_;
  fVar67 = auVar14._0_4_;
  auVar13._4_4_ = fVar67;
  auVar13._0_4_ = fVar67;
  auVar13._8_4_ = fVar67;
  auVar13._12_4_ = fVar67;
  auVar31 = vinsertps_avx(auVar12,auVar11,0x10);
  auVar18 = vinsertps_avx(auVar11,auVar12,0x4c);
  auVar49 = vinsertps_avx(auVar12,auVar11,0x4c);
  auVar27 = vshufps_avx(auVar11,auVar11,0xe1);
  fVar25 = auVar31._0_4_;
  auVar54._0_4_ = fVar25 * fVar67;
  fVar64 = auVar31._4_4_;
  auVar54._4_4_ = fVar64 * fVar67;
  fVar65 = auVar31._8_4_;
  auVar54._8_4_ = fVar65 * fVar67;
  fVar66 = auVar31._12_4_;
  auVar54._12_4_ = fVar66 * fVar67;
  auVar59._0_4_ = auVar18._0_4_ * fVar67;
  auVar59._4_4_ = auVar18._4_4_ * fVar67;
  auVar59._8_4_ = auVar18._8_4_ * fVar67;
  auVar59._12_4_ = auVar18._12_4_ * fVar67;
  auVar45._0_4_ = auVar12._0_4_ * auVar27._0_4_;
  auVar45._4_4_ = auVar12._4_4_ * auVar27._4_4_;
  auVar45._8_4_ = auVar12._8_4_ * auVar27._8_4_;
  auVar45._12_4_ = auVar12._12_4_ * auVar27._12_4_;
  auVar10 = vfnmadd213ps_fma(auVar31,auVar13,auVar54);
  auVar30 = vfnmadd213ps_fma(auVar13,auVar18,auVar59);
  auVar27 = vfmsub213ps_fma(auVar13,auVar49,auVar59);
  auVar13 = vfmsub213ps_fma(auVar13,auVar31,auVar54);
  auVar18 = vfmsub213ps_fma(auVar18,auVar31,auVar45);
  auVar51 = vfnmadd213ps_fma(auVar49,auVar31,auVar45);
  uVar6 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
  auVar9._0_8_ = uVar6 ^ 0x8000000080000000;
  auVar9._8_4_ = -auVar54._8_4_;
  auVar9._12_4_ = -auVar54._12_4_;
  uVar6 = CONCAT44(auVar59._4_4_,auVar59._0_4_);
  auVar60._0_8_ = uVar6 ^ 0x8000000080000000;
  auVar60._8_4_ = -auVar59._8_4_;
  auVar60._12_4_ = -auVar59._12_4_;
  uVar6 = CONCAT44(auVar45._4_4_,auVar45._0_4_);
  auVar63._0_8_ = uVar6 ^ 0x8000000080000000;
  auVar63._8_4_ = -auVar45._8_4_;
  auVar63._12_4_ = -auVar45._12_4_;
  auVar49._0_4_ = auVar30._0_4_ + auVar27._0_4_;
  auVar49._4_4_ = auVar30._4_4_ + auVar27._4_4_;
  auVar49._8_4_ = auVar30._8_4_ + auVar27._8_4_;
  auVar49._12_4_ = auVar30._12_4_ + auVar27._12_4_;
  auVar62._0_4_ = auVar13._0_4_ + auVar10._0_4_;
  auVar62._4_4_ = auVar13._4_4_ + auVar10._4_4_;
  auVar62._8_4_ = auVar13._8_4_ + auVar10._8_4_;
  auVar62._12_4_ = auVar13._12_4_ + auVar10._12_4_;
  auVar58._0_4_ = auVar51._0_4_ + auVar18._0_4_;
  auVar58._4_4_ = auVar51._4_4_ + auVar18._4_4_;
  auVar58._8_4_ = auVar51._8_4_ + auVar18._8_4_;
  auVar58._12_4_ = auVar51._12_4_ + auVar18._12_4_;
  auVar27._0_4_ = auVar49._0_4_ * auVar49._0_4_;
  auVar27._4_4_ = auVar49._4_4_ * auVar49._4_4_;
  auVar27._8_4_ = auVar49._8_4_ * auVar49._8_4_;
  auVar27._12_4_ = auVar49._12_4_ * auVar49._12_4_;
  auVar18 = vfmadd231ps_fma(auVar27,auVar62,auVar62);
  auVar18 = vfmadd231ps_fma(auVar18,auVar58,auVar58);
  auVar41 = vsqrtps_avx(auVar18);
  auVar8 = vdivps_avx512vl(auVar49,auVar41);
  auVar27 = vshufps_avx(auVar9,auVar9,0xf5);
  auVar18 = vmovshdup_avx(auVar10);
  auVar9 = vdivps_avx512vl(auVar62,auVar41);
  auVar49 = vmovshdup_avx(auVar11);
  auVar27 = vfmadd231ss_fma(auVar27,auVar12,auVar14);
  auVar28 = vfmsub231ss_fma(auVar45,auVar49,auVar11);
  auVar13 = vfmsub213ss_fma(auVar11,auVar14,auVar54);
  fVar23 = auVar27._0_4_ + auVar18._0_4_;
  auVar27 = vshufps_avx(auVar60,auVar60,0xf5);
  auVar18 = vmovshdup_avx(auVar30);
  fVar55 = auVar51._0_4_ + auVar28._0_4_;
  fVar22 = auVar13._0_4_ + auVar10._0_4_;
  auVar13 = vshufps_avx(auVar63,auVar63,0xf5);
  auVar27 = vfmadd231ss_fma(auVar27,auVar14,auVar49);
  fVar61 = auVar18._0_4_ + auVar27._0_4_;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar61)),ZEXT416((uint)fVar23),
                            ZEXT416((uint)fVar23));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
  auVar18 = vsqrtss_avx(auVar18,auVar18);
  auVar10 = vdivss_avx512f(ZEXT416((uint)fVar23),auVar18);
  auVar27 = vmovshdup_avx(auVar12);
  fVar61 = fVar61 / auVar18._0_4_;
  auVar45 = ZEXT416((uint)fVar61);
  fVar55 = fVar55 / auVar18._0_4_;
  auVar11 = vmovshdup_avx512vl(auVar9);
  auVar28 = vfmsub231ss_fma(auVar59,auVar14,auVar27);
  auVar13 = vfmadd231ss_fma(auVar13,auVar27,auVar12);
  auVar14 = vmovshdup_avx(auVar51);
  auVar12 = vmovshdup_avx512vl(auVar8);
  auVar18 = vdivps_avx(auVar58,auVar41);
  fVar23 = auVar28._0_4_ + auVar30._0_4_;
  fVar24 = auVar13._0_4_ + auVar14._0_4_;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),ZEXT416((uint)fVar22),
                            ZEXT416((uint)fVar22));
  auVar13 = vmulss_avx512f(auVar45,auVar8);
  fVar68 = auVar10._0_4_;
  auVar13 = vfnmsub231ss_avx512f(auVar13,auVar10,auVar9);
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
  auVar13 = vfnmadd231ss_fma(auVar13,auVar18,ZEXT416((uint)fVar55));
  auVar14 = vsqrtss_avx(auVar14,auVar14);
  fVar20 = auVar14._0_4_;
  fVar53 = auVar18._0_4_;
  if (0.0 <= auVar13._0_4_) {
    auVar14 = vaddss_avx512f(auVar45,auVar8);
    auVar13 = vaddss_avx512f(auVar10,auVar9);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * auVar14._0_4_)),auVar13,auVar13);
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(fVar55 + fVar53)),
                              ZEXT416((uint)(fVar55 + fVar53)));
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    auVar13 = ZEXT416((uint)(auVar14._0_4_ * 0.5));
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar13);
    uVar2 = vcmpss_avx512f(auVar13,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar21 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar14._0_4_));
    fVar21 = fVar21 + fVar21;
  }
  else {
    auVar14 = vsubss_avx512f(auVar45,auVar8);
    auVar13 = vsubss_avx512f(auVar10,auVar9);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * auVar14._0_4_)),auVar13,auVar13);
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)(fVar55 - fVar53)),
                              ZEXT416((uint)(fVar55 - fVar53)));
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    auVar13 = ZEXT416((uint)(auVar14._0_4_ * 0.5));
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar13);
    uVar2 = vcmpss_avx512f(auVar13,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar33._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar14._0_4_));
    auVar33._4_60_ = extraout_var;
    auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar33._0_16_,ZEXT416(0x40490fdb));
    fVar21 = auVar14._0_4_;
  }
  local_178 = auVar12._0_4_;
  auVar14 = vmovshdup_avx(auVar18);
  fVar22 = fVar22 / fVar20;
  auVar13 = vfnmsub231ss_fma(ZEXT416((uint)(local_178 * fVar61)),ZEXT416((uint)fVar68),auVar11);
  auVar13 = vfnmadd231ss_fma(auVar13,ZEXT416((uint)fVar55),auVar14);
  fVar23 = fVar23 / fVar20;
  fVar24 = fVar24 / fVar20;
  fVar57 = auVar14._0_4_;
  fVar20 = auVar11._0_4_;
  if (0.0 <= auVar13._0_4_) {
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((local_178 + fVar61) * (local_178 + fVar61))),
                              ZEXT416((uint)(fVar20 + fVar68)),ZEXT416((uint)(fVar20 + fVar68)));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar57 + fVar55)),
                              ZEXT416((uint)(fVar57 + fVar55)));
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar41 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar41);
    uVar2 = vcmpss_avx512f(auVar41,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar55 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar13._0_4_));
    fVar55 = fVar55 + fVar55;
  }
  else {
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((local_178 - fVar61) * (local_178 - fVar61))),
                              ZEXT416((uint)(fVar20 - fVar68)),ZEXT416((uint)(fVar20 - fVar68)));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar57 - fVar55)),
                              ZEXT416((uint)(fVar57 - fVar55)));
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar41 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar41);
    uVar2 = vcmpss_avx512f(auVar41,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar34._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar13._0_4_));
    auVar34._4_60_ = extraout_var_00;
    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar34._0_16_,ZEXT416(0x40490fdb));
    fVar55 = auVar13._0_4_;
  }
  auVar13 = vfnmsub231ss_fma(ZEXT416((uint)(fVar23 * local_178)),auVar11,ZEXT416((uint)fVar22));
  auVar13 = vfnmadd231ss_fma(auVar13,auVar14,ZEXT416((uint)fVar24));
  if (0.0 <= auVar13._0_4_) {
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((fVar23 + local_178) * (fVar23 + local_178))),
                              ZEXT416((uint)(fVar22 + fVar20)),ZEXT416((uint)(fVar22 + fVar20)));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar24 + fVar57)),
                              ZEXT416((uint)(fVar24 + fVar57)));
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar41 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar41);
    uVar2 = vcmpss_avx512f(auVar41,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_168 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar13._0_4_));
    local_168 = local_168 + local_168;
  }
  else {
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((fVar23 - local_178) * (fVar23 - local_178))),
                              ZEXT416((uint)(fVar22 - fVar20)),ZEXT416((uint)(fVar22 - fVar20)));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar24 - fVar57)),
                              ZEXT416((uint)(fVar24 - fVar57)));
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar41 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar41);
    uVar2 = vcmpss_avx512f(auVar41,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar35._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar13._0_4_));
    auVar35._4_60_ = extraout_var_01;
    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar35._0_16_,ZEXT416(0x40490fdb));
    local_168 = auVar13._0_4_;
  }
  local_e8 = auVar8._0_4_;
  auVar13 = vfnmsub231ss_fma(ZEXT416((uint)(local_e8 * fVar23)),ZEXT416((uint)fVar22),auVar9);
  auVar13 = vfnmadd231ss_fma(auVar13,ZEXT416((uint)fVar24),auVar18);
  if (0.0 <= auVar13._0_4_) {
    auVar13 = ZEXT416((uint)(auVar9._0_4_ + fVar22));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((local_e8 + fVar23) * (local_e8 + fVar23))),auVar13,
                              auVar13);
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar53 + fVar24)),
                              ZEXT416((uint)(fVar53 + fVar24)));
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar41 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar41);
    uVar2 = vcmpss_avx512f(auVar41,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar23 = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar13._0_4_));
    fVar23 = fVar23 + fVar23;
  }
  else {
    auVar13 = ZEXT416((uint)(auVar9._0_4_ - fVar22));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((local_e8 - fVar23) * (local_e8 - fVar23))),auVar13,
                              auVar13);
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar53 - fVar24)),
                              ZEXT416((uint)(fVar53 - fVar24)));
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar41 = ZEXT416((uint)(auVar13._0_4_ * 0.5));
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar41);
    uVar2 = vcmpss_avx512f(auVar41,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar36._0_4_ = asinf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar13._0_4_));
    auVar36._4_60_ = extraout_var_02;
    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar36._0_16_,ZEXT416(0x40490fdb));
    fVar23 = auVar13._0_4_;
  }
  fVar55 = fVar21 + fVar55 + local_168 + fVar23 + -6.2831855;
  if (0.001 <= fVar55) {
    fVar22 = (pRect->super_Tuple3<pbrt::Point3,_float>).y -
             (pRef->super_Tuple3<pbrt::Point3,_float>).y;
    fVar61 = (pRect->super_Tuple3<pbrt::Point3,_float>).x -
             (pRef->super_Tuple3<pbrt::Point3,_float>).x;
    fVar24 = (pRect->super_Tuple3<pbrt::Point3,_float>).z -
             (pRef->super_Tuple3<pbrt::Point3,_float>).z;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * auVar1._0_4_)),ZEXT416((uint)fVar61),
                             ZEXT416((uint)auVar17._0_4_));
    auVar15 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar24),ZEXT416((uint)auVar15._0_4_));
    auVar49 = vminss_avx(auVar49,auVar15);
    uVar2 = vcmpss_avx512f(auVar15,auVar27,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar15._4_12_ = auVar49._4_12_;
    auVar15._0_4_ = (uint)bVar3 * auVar27._0_4_ + (uint)!bVar3 * auVar49._0_4_;
    uVar2 = vcmpss_avx512f(auVar15,ZEXT816(0) << 0x20,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar68 = (float)((uint)bVar3 * 0x2edbe6ff + (uint)!bVar3 * auVar15._0_4_);
    fVar20 = ((fVar67 * fVar67) / (fVar68 * fVar68) + 1.0) - fVar53 * fVar53;
    if (fVar20 < 0.0) {
      auVar37._0_4_ = sqrtf(fVar20);
      auVar37._4_60_ = extraout_var_03;
      auVar49 = auVar37._0_16_;
    }
    else {
      auVar49 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
    }
    if (InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
        ::reg == '\0') {
      iVar7 = __cxa_guard_acquire(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                                   ::reg);
      if (iVar7 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)
                   &InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                    ::reg,InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::
                          Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                          Vector3<float>const&,pbrt::Point3<float>const&)::$_0::__invoke(pbrt::
                          StatsAccumulator__,(PixelAccumFunc)0x0);
        __cxa_guard_release(&InvertSphericalRectangleSample(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&)
                             ::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x438) = *(long *)(in_FS_OFFSET + -0x438) + 1;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar15 = vxorps_avx512vl(auVar14,auVar1);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar56)),ZEXT416((uint)fVar61),
                              ZEXT416((uint)auVar16._0_4_));
    auVar42 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar24),ZEXT416((uint)auVar42._0_4_));
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar16 = vpternlogd_avx512vl(ZEXT416((uint)fVar68),auVar49,auVar16,0xd8);
    fVar22 = auVar16._0_4_;
    if ((fVar22 == 0.0) && (!NAN(fVar22))) {
      *(long *)(in_FS_OFFSET + -0x440) = *(long *)(in_FS_OFFSET + -0x440) + 1;
    }
    auVar41._0_4_ = -(fVar57 * fVar57);
    auVar41._4_4_ = 0x80000000;
    auVar41._8_4_ = 0x80000000;
    auVar41._12_4_ = 0x80000000;
    auVar1 = vinsertps_avx(auVar18,auVar15,0x10);
    auVar17 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar57 * fVar57)),0x1c);
    auVar1 = vfmadd231ps_fma(auVar17,auVar18,auVar1);
    local_188 = -fVar22;
    auVar1 = vhaddps_avx(auVar1,auVar1);
    auVar1 = vmaxss_avx(ZEXT416((uint)(auVar1._0_4_ + fVar20)),ZEXT816(0) << 0x40);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    auVar17 = vpternlogd_avx512vl(ZEXT416((uint)(fVar53 * -fVar22)),auVar8,
                                  ZEXT416((uint)(fVar53 * auVar1._0_4_)),0xb8);
    auVar49 = vpand_avx(auVar8,auVar49);
    auVar15 = vfmadd213ss_fma(auVar15,auVar16,auVar17);
    auVar18 = vfmsub231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar1._0_4_)),auVar18,auVar14);
    auVar38._0_4_ = atan2f(auVar15._0_4_,auVar18._0_4_);
    auVar38._4_60_ = extraout_var_04;
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar38._0_16_,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    uVar2 = vcmpss_avx512f(auVar16,ZEXT416((uint)local_188),0);
    bVar4 = (bool)((byte)uVar2 & 1);
    fVar22 = fVar68 * fVar68 + fVar67 * fVar67;
    local_128 = auVar42._0_4_;
    auVar42._0_4_ = fVar22 + fVar25 * fVar25;
    auVar42._4_4_ = fVar22 + fVar64 * fVar64;
    auVar42._8_4_ = fVar22 + fVar65 * fVar65;
    auVar42._12_4_ = fVar22 + fVar66 * fVar66;
    auVar42 = vsqrtps_avx(auVar42);
    auVar42 = vdivps_avx(auVar31,auVar42);
    auVar31 = vmovshdup_avx(auVar42);
    fVar53 = auVar42._0_4_;
    fVar56 = auVar31._0_4_;
    fVar20 = fVar53 - fVar56;
    auVar12._0_4_ = -(fVar53 * fVar56);
    auVar12._4_4_ = 0x80000000;
    auVar12._8_4_ = 0x80000000;
    auVar12._12_4_ = 0x80000000;
    auVar51._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar51._8_4_ = auVar42._8_4_ ^ 0x80000000;
    auVar51._12_4_ = auVar42._12_4_ ^ 0x80000000;
    auVar18 = vinsertps_avx(auVar42,auVar51,0x10);
    auVar16 = vinsertps_avx(auVar12,ZEXT416((uint)(fVar53 * fVar56)),0x1c);
    auVar42 = vfmadd231ps_fma(auVar16,auVar42,auVar18);
    fVar61 = local_128 * local_128 + fVar22;
    auVar17._8_4_ = 0x7fffffff;
    auVar17._0_8_ = 0x7fffffff7fffffff;
    auVar17._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl(ZEXT416((uint)fVar20),auVar17);
    auVar42 = vhaddps_avx(auVar42,auVar42);
    fVar24 = local_128 * local_128 * fVar61;
    if (fVar24 < 0.0) {
      fVar25 = sqrtf(fVar24);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar25 = auVar16._0_4_;
    }
    fVar20 = fVar20 * fVar20;
    if (fVar24 < 0.0) {
      fVar24 = sqrtf(fVar24);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar24 = auVar16._0_4_;
    }
    auVar16 = vsqrtss_avx(auVar30,ZEXT416((uint)fVar22));
    auVar43._8_4_ = 0x3f800000;
    auVar43._0_8_ = 0x3f8000003f800000;
    auVar43._12_4_ = 0x3f800000;
    auVar46._4_4_ = fVar20;
    auVar46._0_4_ = fVar20;
    auVar46._8_4_ = fVar20;
    auVar46._12_4_ = fVar20;
    auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ - (auVar18._0_4_ * fVar25) / fVar61)),
                            ZEXT416((uint)(auVar42._0_4_ + (auVar18._0_4_ * fVar24) / fVar61)),0x10)
    ;
    auVar42 = vdivps_avx(auVar42,auVar46);
    fStack_174 = auVar31._4_4_;
    fStack_170 = auVar31._8_4_;
    fStack_16c = auVar31._12_4_;
    auVar52._0_4_ = auVar42._0_4_ * fVar56;
    auVar52._4_4_ = auVar42._4_4_ * fStack_174;
    auVar52._8_4_ = auVar42._8_4_ * fStack_170;
    auVar52._12_4_ = auVar42._12_4_ * fStack_16c;
    auVar18 = vsubps_avx(auVar43,auVar42);
    auVar47._4_4_ = fVar53;
    auVar47._0_4_ = fVar53;
    auVar47._8_4_ = fVar53;
    auVar47._12_4_ = fVar53;
    auVar18 = vfmadd213ps_fma(auVar47,auVar18,auVar52);
    fVar22 = auVar18._0_4_;
    auVar30._0_4_ = fVar22 * fVar22;
    fVar61 = auVar18._4_4_;
    auVar30._4_4_ = fVar61 * fVar61;
    fVar24 = auVar18._8_4_;
    auVar30._8_4_ = fVar24 * fVar24;
    fVar20 = auVar18._12_4_;
    auVar30._12_4_ = fVar20 * fVar20;
    auVar18 = vmovshdup_avx(auVar30);
    fVar53 = 1.0 - auVar30._0_4_;
    if (fVar53 < 0.0) {
      auVar39._0_4_ = sqrtf(fVar53);
      auVar39._4_60_ = extraout_var_05;
      auVar31 = auVar39._0_16_;
    }
    else {
      auVar31 = vsqrtss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53));
    }
    fVar53 = auVar16._0_4_;
    auVar48._0_4_ = fVar53 * fVar22;
    auVar48._4_4_ = fVar53 * fVar61;
    auVar48._8_4_ = fVar53 * fVar24;
    auVar48._12_4_ = fVar53 * fVar20;
    fVar22 = 1.0 - auVar18._0_4_;
    if (fVar22 < 0.0) {
      auVar40._0_4_ = sqrtf(fVar22);
      auVar40._4_60_ = extraout_var_06;
      auVar18 = auVar40._0_16_;
    }
    else {
      auVar18 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
    }
    auVar49 = ZEXT416((uint)((fVar23 + (float)((uint)bVar4 * 0x40490fdb +
                                              (uint)!bVar4 *
                                              ((uint)bVar3 * (int)(auVar38._0_4_ + -6.2831855) +
                                              (uint)!bVar3 * (int)auVar38._0_4_)) + local_168) /
                            fVar55));
    auVar18 = vinsertps_avx(auVar31,auVar18,0x10);
    auVar44._4_4_ = local_128;
    auVar44._0_4_ = local_128;
    auVar44._8_4_ = local_128;
    auVar44._12_4_ = local_128;
    uVar2 = vcmpss_avx512f(auVar49,ZEXT816(0) << 0x40,1);
    auVar18 = vdivps_avx(auVar48,auVar18);
    auVar18 = vsubps_avx(auVar18,auVar44);
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(auVar18,auVar5);
    auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar49);
    iVar7 = (uint)!(bool)((byte)uVar2 & 1) * auVar18._0_4_;
    auVar19._4_12_ = auVar18._4_12_;
    auVar19._0_4_ = iVar7;
    auVar18 = vshufps_avx(auVar16,auVar16,0xf5);
    if (auVar18._0_4_ <= auVar16._0_4_) {
      auVar32._4_12_ = auVar42._4_12_;
      auVar32._0_4_ = iVar7;
      TVar26 = auVar32._0_8_;
    }
    else {
      auVar42 = vinsertps_avx(auVar19,ZEXT416((uint)auVar42._0_4_),0x1c);
      TVar26 = auVar42._0_8_;
    }
  }
  else {
    fVar23 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar55 = (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar22 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
    fVar61 = (pRect->super_Tuple3<pbrt::Point3,_float>).y - (s->super_Tuple3<pbrt::Point3,_float>).y
    ;
    auVar16 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).x -
                            (s->super_Tuple3<pbrt::Point3,_float>).x));
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar23)),auVar16,ZEXT416((uint)fVar55));
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),ZEXT416((uint)fVar55),
                              ZEXT416((uint)fVar55));
    auVar31 = ZEXT416((uint)((pRect->super_Tuple3<pbrt::Point3,_float>).z -
                            (s->super_Tuple3<pbrt::Point3,_float>).z));
    auVar42 = vfmadd231ss_fma(auVar42,auVar31,ZEXT416((uint)fVar22));
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
    auVar50._0_4_ = auVar42._0_4_ / auVar18._0_4_;
    auVar50._4_12_ = auVar42._4_12_;
    fVar23 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
    fVar55 = (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar23)),ZEXT416((uint)fVar55),auVar16);
    fVar22 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),ZEXT416((uint)fVar55),
                              ZEXT416((uint)fVar55));
    auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar22),auVar31);
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
    auVar29._0_4_ = auVar42._0_4_ / auVar18._0_4_;
    auVar29._4_12_ = auVar42._4_12_;
    auVar42 = vinsertps_avx(auVar50,auVar29,0x10);
    TVar26 = auVar42._0_8_;
  }
  return (Point2f)TVar26;
}

Assistant:

Point2f InvertSphericalRectangleSample(const Point3f &pRef, const Point3f &s,
                                       const Vector3f &ex, const Vector3f &ey,
                                       const Point3f &pRect) {
    // TODO: Delete anything unused in the below...

    // SphQuadInit()
    // local reference system 'R'
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);

    // compute rectangle coords in local reference system
    Vector3f d = s - pRef;
    Vector3f dLocal = R.ToLocal(d);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float z0sq = Sqr(z0);
    Float x0 = dLocal.x;
    Float y0 = dLocal.y;
    Float x1 = x0 + exl;
    Float y1 = y0 + eyl;
    Float y0sq = Sqr(y0), y1sq = Sqr(y1);

    // create vectors to four vertices
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);

    // compute normals to edges
    Vector3f n0 = Normalize(Cross(v00, v10));
    Vector3f n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01));
    Vector3f n3 = Normalize(Cross(v01, v00));

    // compute internal angles (gamma_i)
    Float g0 = AngleBetween(-n0, n1);
    Float g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3);
    Float g3 = AngleBetween(-n3, n0);

    // compute predefined constants
    Float b0 = n0.z, b1 = n2.z, b0sq = Sqr(b0), b1sq = Sqr(b1);

    // compute solid angle from internal angles
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;

    // TODO: this (rarely) goes differently than sample. figure out why...
    if (solidAngle < 1e-3) {
        Vector3f pq = pRect - s;
        return Point2f(Dot(pq, ex) / LengthSquared(ex), Dot(pq, ey) / LengthSquared(ey));
    }

    Vector3f v = R.ToLocal(pRect - pRef);
    Float xu = v.x, yv = v.y;

    xu = Clamp(xu, x0, x1);  // avoid Infs
    if (xu == 0)
        xu = 1e-10;

    // DOing all this in double actually makes things slightly worse???!?
    // Float fusq = (1 - b0sq * Sqr(cu)) / Sqr(cu);
    // Float fusq = 1 / Sqr(cu) - b0sq;  // more stable
    Float invcusq = 1 + z0sq / Sqr(xu);
    Float fusq = invcusq - b0sq;  // the winner so far
    Float fu = std::copysign(std::sqrt(fusq), xu);
    // Note, though have 1 + z^2/x^2 - b0^2, which isn't great if b0 \approx 1
    // double fusq = 1. - Sqr(double(b0)) + Sqr(double(z0) / double(xu));  //
    // this is worse?? double fu = std::copysign(std::sqrt(fusq), cu);
    CHECK_RARE(1e-6, fu == 0);

    // State of the floating point world: in the bad cases, about half the
    // error seems to come from inaccuracy in fu and half comes from
    // inaccuracy in sqrt/au.
    //
    // For fu, the main issue comes adding a small value to 1+ in invcusq
    // and then having b0sq be close to one, so having catastrophic
    // cancellation affect fusq. Approximating it as z0sq / Sqr(xu) when
    // b0sq is close to one doesn't help, however..
    //
    // For au, DifferenceOfProducts doesn't seem to help with the two
    // factors. Furthermore, while it would be nice to think about this
    // like atan(y/x) and then rewrite/simplify y/x, we need to do so in a
    // way that doesn't flip the sign of x and y, which would be fine if we
    // were computing y/x, but messes up atan2's quadrant-determinations...

    Float sqrt = SafeSqrt(DifferenceOfProducts(b0, b0, b1, b1) + fusq);
    // No benefit to difference of products here...
    Float au = std::atan2(-(b1 * fu) - std::copysign(b0 * sqrt, fu * b0),
                          b0 * b1 - sqrt * std::abs(fu));
    if (au > 0)
        au -= 2 * Pi;

    if (fu == 0)
        au = Pi;
    Float u0 = (au + g2 + g3) / solidAngle;

    Float ddsq = Sqr(xu) + z0sq;
    Float dd = std::sqrt(ddsq);
    Float h0 = y0 / std::sqrt(ddsq + y0sq);
    Float h1 = y1 / std::sqrt(ddsq + y1sq);
    Float yvsq = Sqr(yv);

    Float u1[2] = {(DifferenceOfProducts(h0, h0, h0, h1) -
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1),
                   (DifferenceOfProducts(h0, h0, h0, h1) +
                    std::abs(h0 - h1) * std::sqrt(yvsq * (ddsq + yvsq)) / (ddsq + yvsq)) /
                       Sqr(h0 - h1)};

    // TODO: yuck is there a better way to figure out which is the right
    // solution?
    Float hv[2] = {Lerp(u1[0], h0, h1), Lerp(u1[1], h0, h1)};
    Float hvsq[2] = {Sqr(hv[0]), Sqr(hv[1])};
    Float yz[2] = {(hv[0] * dd) / std::sqrt(1 - hvsq[0]),
                   (hv[1] * dd) / std::sqrt(1 - hvsq[1])};

    Point2f u = (std::abs(yz[0] - yv) < std::abs(yz[1] - yv))
                    ? Point2f(Clamp(u0, 0, 1), u1[0])
                    : Point2f(Clamp(u0, 0, 1), u1[1]);

    return u;
}